

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringlist.cpp
# Opt level: O3

void QtPrivate::QStringList_replaceInStrings
               (QStringList *that,QStringView before,QStringView after,CaseSensitivity cs)

{
  ulong uVar1;
  QString *pQVar2;
  qsizetype qVar3;
  pointer pQVar4;
  long lVar5;
  ulong uVar6;
  QStringView haystack0;
  
  uVar1 = (that->d).size;
  if (uVar1 != 0) {
    pQVar2 = (that->d).ptr;
    lVar5 = 0;
    uVar6 = 0;
    do {
      haystack0.m_data = *(storage_type_conflict **)((long)&(pQVar2->d).ptr + lVar5);
      haystack0.m_size = *(qsizetype *)((long)&(pQVar2->d).size + lVar5);
      qVar3 = findString(haystack0,0,before,cs);
      if (qVar3 != -1) {
        if (uVar1 <= uVar6) {
          return;
        }
        do {
          pQVar4 = QList<QString>::data(that);
          QString::replace((QString *)((long)&(pQVar4->d).d + lVar5),(QChar *)before.m_data,
                           before.m_size,(QChar *)after.m_data,after.m_size,cs);
          uVar6 = uVar6 + 1;
          lVar5 = lVar5 + 0x18;
        } while (uVar6 < (ulong)(that->d).size);
        return;
      }
      uVar6 = uVar6 + 1;
      lVar5 = lVar5 + 0x18;
    } while (uVar1 != uVar6);
  }
  return;
}

Assistant:

void QtPrivate::QStringList_replaceInStrings(QStringList *that, QStringView before,
                                             QStringView after, Qt::CaseSensitivity cs)
{
    // Before potentially detaching "that" list, check if any string contains "before"
    qsizetype i = -1;
    for (qsizetype j = 0; j < that->size(); ++j) {
        if (that->at(j).contains(before, cs)) {
            i = j;
            break;
        }
    }
    if (i == -1)
        return;

    for (; i < that->size(); ++i)
        (*that)[i].replace(before.data(), before.size(), after.data(), after.size(), cs);
}